

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.hpp
# Opt level: O1

format_error * __thiscall
boost::runtime::specific_param_error<boost::runtime::format_error,_boost::runtime::input_error>::
operator<<(format_error *__return_storage_ptr__,
          specific_param_error<boost::runtime::format_error,_boost::runtime::input_error> *this,
          char *val)

{
  pointer pcVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  
  std::__cxx11::string::append((char *)&(this->super_input_error).super_param_error.msg);
  *(undefined ***)
   &(__return_storage_ptr__->
    super_specific_param_error<boost::runtime::format_error,_boost::runtime::input_error>).
    super_input_error.super_param_error = &PTR__param_error_001cbb58;
  uVar2 = *(undefined4 *)((long)&(this->super_input_error).super_param_error.param_name.m_begin + 4)
  ;
  uVar3 = *(undefined4 *)&(this->super_input_error).super_param_error.param_name.m_end;
  uVar4 = *(undefined4 *)((long)&(this->super_input_error).super_param_error.param_name.m_end + 4);
  *(undefined4 *)
   &(__return_storage_ptr__->
    super_specific_param_error<boost::runtime::format_error,_boost::runtime::input_error>).
    super_input_error.super_param_error.param_name.m_begin =
       *(undefined4 *)&(this->super_input_error).super_param_error.param_name.m_begin;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->
           super_specific_param_error<boost::runtime::format_error,_boost::runtime::input_error>).
           super_input_error.super_param_error.param_name.m_begin + 4) = uVar2;
  *(undefined4 *)
   &(__return_storage_ptr__->
    super_specific_param_error<boost::runtime::format_error,_boost::runtime::input_error>).
    super_input_error.super_param_error.param_name.m_end = uVar3;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->
           super_specific_param_error<boost::runtime::format_error,_boost::runtime::input_error>).
           super_input_error.super_param_error.param_name.m_end + 4) = uVar4;
  (__return_storage_ptr__->
  super_specific_param_error<boost::runtime::format_error,_boost::runtime::input_error>).
  super_input_error.super_param_error.msg._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->
                 super_specific_param_error<boost::runtime::format_error,_boost::runtime::input_error>
                 ).super_input_error.super_param_error.msg.field_2;
  pcVar1 = (this->super_input_error).super_param_error.msg._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)
             &(__return_storage_ptr__->
              super_specific_param_error<boost::runtime::format_error,_boost::runtime::input_error>)
              .super_input_error.super_param_error.msg,pcVar1,
             pcVar1 + (this->super_input_error).super_param_error.msg._M_string_length);
  *(undefined ***)
   &(__return_storage_ptr__->
    super_specific_param_error<boost::runtime::format_error,_boost::runtime::input_error>).
    super_input_error.super_param_error = &PTR__param_error_001cc128;
  return __return_storage_ptr__;
}

Assistant:

Derived operator<<(char const* val) &&
    {
        this->msg.append( val );

        return reinterpret_cast<Derived&&>(*this);
    }